

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

bool vkt::ssbo::anon_unknown_15::compareComponents
               (DataType scalarType,void *ref,void *res,int numComps)

{
  float fVar1;
  deUint32 resVal_2;
  deUint32 refVal_2;
  int ndx_2;
  deUint32 resVal_1;
  deUint32 refVal_1;
  int ndx_1;
  float resVal;
  float refVal;
  int ndx;
  float threshold;
  int numComps_local;
  void *res_local;
  void *ref_local;
  DataType scalarType_local;
  
  if (scalarType == TYPE_FLOAT) {
    for (resVal = 0.0; (int)resVal < numComps; resVal = (float)((int)resVal + 1)) {
      fVar1 = deFloatAbs(*(float *)((long)res + (long)(int)resVal * 4) -
                         *(float *)((long)ref + (long)(int)resVal * 4));
      if (0.05 <= fVar1) {
        return false;
      }
    }
  }
  else if (scalarType == TYPE_BOOL) {
    for (resVal_1 = 0; (int)resVal_1 < numComps; resVal_1 = resVal_1 + 1) {
      if ((*(int *)((long)ref + (long)(int)resVal_1 * 4) != 0) !=
          (*(int *)((long)res + (long)(int)resVal_1 * 4) != 0)) {
        return false;
      }
    }
  }
  else {
    for (resVal_2 = 0; (int)resVal_2 < numComps; resVal_2 = resVal_2 + 1) {
      if (*(int *)((long)ref + (long)(int)resVal_2 * 4) !=
          *(int *)((long)res + (long)(int)resVal_2 * 4)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compareComponents (glu::DataType scalarType, const void* ref, const void* res, int numComps)
{
	if (scalarType == glu::TYPE_FLOAT)
	{
		const float threshold = 0.05f; // Same as used in shaders - should be fine for values being used.

		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const float		refVal		= *((const float*)ref + ndx);
			const float		resVal		= *((const float*)res + ndx);

			if (deFloatAbs(resVal - refVal) >= threshold)
				return false;
		}
	}
	else if (scalarType == glu::TYPE_BOOL)
	{
		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const deUint32	refVal		= *((const deUint32*)ref + ndx);
			const deUint32	resVal		= *((const deUint32*)res + ndx);

			if ((refVal != 0) != (resVal != 0))
				return false;
		}
	}
	else
	{
		DE_ASSERT(scalarType == glu::TYPE_INT || scalarType == glu::TYPE_UINT);

		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const deUint32	refVal		= *((const deUint32*)ref + ndx);
			const deUint32	resVal		= *((const deUint32*)res + ndx);

			if (refVal != resVal)
				return false;
		}
	}

	return true;
}